

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_det_gen(REF_INT n,REF_DBL *orig,REF_DBL *det)

{
  double dVar1;
  REF_STATUS RVar2;
  void *__ptr;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  __ptr = malloc((ulong)(uint)(n * n) << 3);
  if (__ptr == (void *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x4df,
           "ref_matrix_det_gen","malloc a of REF_DBL NULL");
    RVar2 = 2;
  }
  else {
    uVar6 = 0;
    uVar3 = 0;
    if (0 < n) {
      uVar3 = (ulong)(uint)n;
    }
    lVar4 = (long)n;
    pvVar7 = __ptr;
    for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
      for (uVar9 = 0; (uint)n != uVar9; uVar9 = uVar9 + 1) {
        *(REF_DBL *)((long)pvVar7 + uVar9 * 8) = orig[uVar9];
      }
      orig = orig + lVar4;
      pvVar7 = (void *)((long)pvVar7 + lVar4 * 8);
    }
    *det = 1.0;
    iVar5 = 1;
    dVar14 = 1.0;
    lVar8 = 0;
    uVar6 = 0;
    while (uVar6 != uVar3) {
      lVar10 = (long)iVar5;
      lVar11 = lVar10 * 8;
      lVar12 = uVar6 * lVar4;
      dVar14 = dVar14 * *(double *)((long)__ptr + uVar6 * 8 + lVar12 * 8);
      *det = dVar14;
      for (; lVar10 < lVar4; lVar10 = lVar10 + 1) {
        dVar1 = *(double *)((long)__ptr + uVar6 * 8 + lVar12 * 8);
        dVar16 = dVar1 * 1e+20;
        if (dVar16 <= -dVar16) {
          dVar16 = -dVar16;
        }
        dVar17 = *(double *)((long)__ptr + lVar10 * 8 + lVar12 * 8);
        dVar15 = -dVar17;
        if (dVar17 <= dVar15) {
          dVar17 = dVar15;
        }
        if (dVar16 <= dVar17) {
          free(__ptr);
          *det = 0.0;
          goto LAB_001717e7;
        }
        uVar9 = (ulong)(uint)n;
        pvVar7 = __ptr;
        while (bVar13 = uVar9 != 0, uVar9 = uVar9 - 1, bVar13) {
          *(double *)((long)pvVar7 + lVar11) =
               *(double *)((long)pvVar7 + lVar8) * (dVar15 / dVar1) +
               *(double *)((long)pvVar7 + lVar11);
          pvVar7 = (void *)((long)pvVar7 + lVar4 * 8);
        }
        lVar11 = lVar11 + 8;
      }
      iVar5 = iVar5 + 1;
      lVar8 = lVar8 + 8;
      uVar6 = uVar6 + 1;
    }
    free(__ptr);
LAB_001717e7:
    RVar2 = 0;
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_det_gen(REF_INT n, REF_DBL *orig, REF_DBL *det) {
  REF_DBL *a;
  REF_DBL scale;
  REF_INT i, j, k;

  ref_malloc(a, n * n, REF_DBL);

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) a[i + n * j] = orig[i + n * j];

  *det = 1.0;

  for (j = 0; j < n; j++) {
    (*det) *= a[j + n * j];
    /* eliminate lower triangle */
    for (i = j + 1; i < n; i++) {
      if (!ref_math_divisible(a[i + j * n], a[j + j * n])) {
        /* zero pivot */
        ref_free(a);
        *det = 0.0;
        return REF_SUCCESS;
      }
      scale = a[i + j * n] / a[j + j * n];
      for (k = 0; k < n; k++) a[i + k * n] -= scale * a[j + k * n];
    }
  }

  ref_free(a);

  return REF_SUCCESS;
}